

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckArray2DClose<float[2][2],float_const*const*,float>
               (TestResults *results,float (*expected) [2] [2],float ***actual,int rows,int columns,
               float *tolerance,TestDetails *details)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *failure;
  ulong uVar4;
  int actualRow;
  ulong uVar5;
  byte bVar6;
  int expectedColumn;
  ulong uVar7;
  int actualColumn;
  MemoryOutStream stream;
  MemoryOutStream local_1c8;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar4 = uVar5;
  }
  bVar6 = 1;
  for (; uVar4 * 8 - uVar5 != 0; uVar5 = uVar5 + 8) {
    bVar1 = ArrayAreClose<float[2],float_const*,float>
                      ((float (*) [2])((long)(*expected)[0] + uVar5),
                       (float **)((long)*actual + uVar5),columns,tolerance);
    bVar6 = bVar6 & bVar1;
  }
  if (bVar6 == 0) {
    MemoryOutStream::MemoryOutStream(&local_1c8);
    std::operator<<((ostream *)&local_1c8,"Expected [ ");
    uVar3 = 0;
    uVar5 = (ulong)(uint)columns;
    if (columns < 1) {
      uVar5 = uVar3;
    }
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&local_1c8,"[ ");
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        poVar2 = (ostream *)
                 std::ostream::operator<<(&local_1c8,(*(float (*) [2])(*expected)[0])[uVar7]);
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)&local_1c8,"] ");
      expected = (float (*) [2] [2])((long)expected + 8);
    }
    poVar2 = std::operator<<((ostream *)&local_1c8,"] +/- ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*tolerance);
    std::operator<<(poVar2," but was [ ");
    for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&local_1c8,"[ ");
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        poVar2 = (ostream *)std::ostream::operator<<(&local_1c8,(*actual)[uVar3][uVar7]);
        std::operator<<(poVar2," ");
      }
      std::operator<<((ostream *)&local_1c8,"] ");
    }
    std::operator<<((ostream *)&local_1c8,"]");
    failure = MemoryOutStream::GetText(&local_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c8);
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}